

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O0

void save_resets(FILE *fp,AREA_DATA_conflict *pArea)

{
  short sVar1;
  ROOM_INDEX_DATA *pRVar2;
  char *pcVar3;
  long in_RSI;
  FILE *in_RDI;
  int i;
  ROOM_INDEX_DATA *pRoomIndex;
  RESET_DATA *pReset;
  char *local_68;
  flag_type *in_stack_ffffffffffffffa0;
  FILE *in_stack_ffffffffffffffa8;
  int local_24;
  RESET_DATA *local_18;
  
  fprintf(in_RDI,"#RESETS\n");
  local_68 = (char *)in_stack_ffffffffffffffa0;
  for (local_24 = (int)*(short *)(in_RSI + 0x58); local_24 < *(short *)(in_RSI + 0x5a) + 1;
      local_24 = local_24 + 1) {
    pRVar2 = get_room_index((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if (pRVar2 != (ROOM_INDEX_DATA *)0x0) {
      for (local_18 = pRVar2->reset_first; local_18 != (RESET_DATA *)0x0; local_18 = local_18->next)
      {
        switch(local_18->command) {
        case 'D':
          if (local_18->arg3 == 0) {
            local_68 = "OPEN";
          }
          else if (local_18->arg3 == 1) {
            local_68 = "CLOSED";
          }
          else {
            local_68 = "LOCKED";
          }
          in_stack_ffffffffffffffa8 = in_RDI;
          fprintf(in_RDI,"DOOR %d %s %s\n",(ulong)(uint)(int)local_18->arg1,
                  direction_table[local_18->arg2].name,local_68);
          break;
        case 'E':
          sVar1 = local_18->arg1;
          pcVar3 = flag_name_lookup((long)in_stack_ffffffffffffffa8,(flag_type *)local_68);
          pcVar3 = upstring(pcVar3);
          fprintf(in_RDI,"EQUIP %d %s\n",(ulong)(uint)(int)sVar1,pcVar3);
          break;
        case 'F':
          fprintf(in_RDI,"FOLLOW %d %d\n",(ulong)(uint)(int)local_18->arg1,
                  (ulong)(uint)(int)local_18->arg2);
          break;
        case 'G':
          fprintf(in_RDI,"GIVE %d\n",(ulong)(uint)(int)local_18->arg1);
          break;
        default:
          break;
        case 'M':
          fprintf(in_RDI,"MOB %d TO %d GLIMIT %d LLIMIT %d\n",(ulong)(uint)(int)local_18->arg1,
                  (ulong)(uint)(int)local_18->arg3,(ulong)(uint)(int)local_18->arg2,
                  (ulong)(uint)(int)local_18->arg4);
          break;
        case 'O':
          fprintf(in_RDI,"OBJECT %d TO %d\n",(ulong)(uint)(int)local_18->arg1,
                  (ulong)(uint)(int)local_18->arg3);
          break;
        case 'P':
          fprintf(in_RDI,"PUT %d IN %d COUNT %d\n",(ulong)(uint)(int)local_18->arg1,
                  (ulong)(uint)(int)local_18->arg3,(ulong)(uint)(int)local_18->arg4);
          break;
        case 'R':
          fprintf(in_RDI,"RANDOMIZE %d %d\n",(ulong)(uint)(int)local_18->arg1,
                  (ulong)(uint)(int)local_18->arg2);
        }
      }
    }
  }
  fprintf(in_RDI,"S\n\n");
  return;
}

Assistant:

void save_resets(FILE *fp, AREA_DATA *pArea)
{
	RESET_DATA *pReset;
	ROOM_INDEX_DATA *pRoomIndex;
	int i;

	fprintf(fp, "#RESETS\n");

	for (i = pArea->min_vnum; i < (pArea->max_vnum + 1); i++)
	{
		if ((pRoomIndex = get_room_index(i)) == nullptr)
			continue;

		for (pReset = pRoomIndex->reset_first; pReset != nullptr; pReset = pReset->next)
		{
			switch (pReset->command)
			{
				case 'M':
					fprintf(fp, "MOB %d TO %d GLIMIT %d LLIMIT %d\n", pReset->arg1, pReset->arg3, pReset->arg2, pReset->arg4);
					break;
				case 'O':
					fprintf(fp, "OBJECT %d TO %d\n", pReset->arg1, pReset->arg3);
					break;
				case 'P':
					fprintf(fp, "PUT %d IN %d COUNT %d\n", pReset->arg1, pReset->arg3, pReset->arg4);
					break;
				case 'G':
					fprintf(fp, "GIVE %d\n", pReset->arg1);
					break;
				case 'F':
					fprintf(fp, "FOLLOW %d %d\n", pReset->arg1, pReset->arg2);
					break;
				case 'E':
					fprintf(fp, "EQUIP %d %s\n", pReset->arg1, (upstring(flag_name_lookup(pReset->arg3, wear_locations))));
					break;
				case 'D':
					fprintf(fp, "DOOR %d %s %s\n",
						pReset->arg1,
						direction_table[pReset->arg2].name,
						pReset->arg3 == 0 ? "OPEN" : 
							pReset->arg3 == 1 ? "CLOSED" : "LOCKED");
					break;
				case 'R':
					fprintf(fp, "RANDOMIZE %d %d\n", pReset->arg1, pReset->arg2);
					break;
				default:
					break;
			}
		}
	}

	fprintf(fp, "S\n\n");
}